

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::
     draw_elements_instanced_base_vertex_primitive_mode_mismatch(NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  ProgramSources *sources;
  allocator<char> local_205;
  GLfloat vertices [1];
  string local_200;
  undefined1 local_1e0 [40];
  ProgramSources local_1b8;
  ShaderProgram geometryProgram;
  
  renderCtx = ctx->m_renderCtx;
  memset(&local_1b8,0,0xac);
  local_1b8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.separable = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "#version 320 es\nlayout(points) in;\nlayout(points, max_vertices = 3) out;\nvoid main (void)\n{\n}\n"
             ,&local_205);
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1e0,&local_200);
  sources = glu::ProgramSources::operator<<(&local_1b8,(ShaderSource *)local_1e0);
  glu::ShaderProgram::ShaderProgram(&geometryProgram,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_1e0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,
             "GL_INVALID_OPERATION is generated if a geometry shader is active and mode is incompatible with the input primitive type of the geometry shader in the currently installed program object."
             ,(allocator<char> *)local_1e0);
  NegativeTestContext::beginSection(ctx,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,geometryProgram.m_program.m_program);
  glu::CallLogWrapper::glDrawElementsInstancedBaseVertex
            (&ctx->super_CallLogWrapper,4,1,0x1405,vertices,1,1);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&geometryProgram);
  return;
}

Assistant:

void draw_elements_instanced_base_vertex_primitive_mode_mismatch (NegativeTestContext& ctx)
{
	GLfloat						vertices[1];
	glu::ShaderProgram			geometryProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::GeometrySource(geometryShaderSource));

	ctx.beginSection("GL_INVALID_OPERATION is generated if a geometry shader is active and mode is incompatible with the input primitive type of the geometry shader in the currently installed program object.");
	ctx.glUseProgram(geometryProgram.getProgram());
	ctx.glDrawElementsInstancedBaseVertex(GL_TRIANGLES, 1, GL_UNSIGNED_INT, vertices, 1, 1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}